

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

int Wln_NtkIsAcyclic(Wln_Ntk_t *p)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  byte local_4d;
  int local_28;
  uint local_24;
  int nPrinted;
  int nSinks;
  int nUnvisited;
  int iObj;
  int i;
  int fAcyclic;
  Wln_Ntk_t *p_local;
  
  nPrinted = 0;
  Wln_NtkIncrementTravId(p);
  Wln_NtkIncrementTravId(p);
  iObj = 1;
  for (nUnvisited = 0; iVar2 = Wln_NtkCoNum(p), nUnvisited < iVar2; nUnvisited = nUnvisited + 1) {
    uVar3 = Wln_NtkCo(p,nUnvisited);
    iObj = Wln_NtkIsAcyclic_rec(p,uVar3);
    pFVar1 = _stdout;
    if (iObj == 0) {
      pcVar4 = Wln_ObjName(p,uVar3);
      fprintf(pFVar1,"Primary output %16s (ID %6d)\n",pcVar4,(ulong)uVar3);
      return 0;
    }
  }
  for (nUnvisited = 0; iVar2 = Wln_NtkFfNum(p), nUnvisited < iVar2; nUnvisited = nUnvisited + 1) {
    uVar3 = Wln_NtkFf(p,nUnvisited);
    iObj = Wln_NtkIsAcyclic_rec(p,uVar3);
    pFVar1 = _stdout;
    if (iObj == 0) {
      pcVar4 = Wln_ObjName(p,uVar3);
      fprintf(pFVar1,"Flip-flop %16s (ID %6d)\n",pcVar4,(ulong)uVar3);
      return 0;
    }
  }
  for (nSinks = 1; iVar2 = Wln_NtkObjNum(p), nSinks < iVar2; nSinks = nSinks + 1) {
    iVar2 = Wln_ObjIsTravIdPrevious(p,nSinks);
    local_4d = 0;
    if (iVar2 == 0) {
      iVar2 = Wln_ObjIsCi(p,nSinks);
      local_4d = iVar2 != 0 ^ 0xff;
    }
    nPrinted = (uint)(local_4d & 1) + nPrinted;
  }
  if (nPrinted != 0) {
    local_24 = 0;
    Wln_NtkCreateRefs(p);
    uVar3 = Wln_NtkObjNum(p);
    iVar2 = Wln_NtkObjNum(p);
    printf("The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n"
           ,((double)nPrinted * 100.0) / (double)iVar2,(ulong)uVar3,(ulong)(uint)nPrinted);
    for (nSinks = 1; iVar2 = Wln_NtkObjNum(p), nSinks < iVar2; nSinks = nSinks + 1) {
      iVar2 = Wln_ObjRefs(p,nSinks);
      if ((((iVar2 == 0) && (iVar2 = Wln_ObjIsCi(p,nSinks), iVar2 == 0)) &&
          (iVar2 = Wln_ObjIsCo(p,nSinks), iVar2 == 0)) &&
         (iVar2 = Wln_ObjIsFf(p,nSinks), iVar2 == 0)) {
        local_24 = local_24 + 1;
      }
    }
    if (local_24 != 0) {
      local_28 = 0;
      printf("These unconnected objects feed into %d sink objects without fanout:\n",(ulong)local_24
            );
      for (nSinks = 1; iVar2 = Wln_NtkObjNum(p), nSinks < iVar2; nSinks = nSinks + 1) {
        iVar2 = Wln_ObjRefs(p,nSinks);
        if (((iVar2 == 0) && (iVar2 = Wln_ObjIsCi(p,nSinks), iVar2 == 0)) &&
           ((iVar2 = Wln_ObjIsCo(p,nSinks), iVar2 == 0 &&
            (iVar2 = Wln_ObjIsFf(p,nSinks), pFVar1 = _stdout, iVar2 == 0)))) {
          pcVar4 = Wln_ObjName(p,nSinks);
          iVar2 = Wln_ObjType(p,nSinks);
          pcVar5 = Abc_OperName(iVar2);
          uVar3 = Wln_ObjType(p,nSinks);
          fprintf(pFVar1,"Node %16s (ID %6d) of type %5s (type ID %2d)\n",pcVar4,(ulong)(uint)nSinks
                  ,pcVar5,(ulong)uVar3);
          local_28 = local_28 + 1;
          if (local_28 == 5) break;
        }
      }
      if (local_28 < (int)local_24) {
        printf("...\n");
      }
    }
    for (nSinks = 1; iVar2 = Wln_NtkObjNum(p), nSinks < iVar2; nSinks = nSinks + 1) {
      iVar2 = Wln_ObjIsTravIdPrevious(p,nSinks);
      if (((iVar2 == 0) && (iVar2 = Wln_ObjIsCi(p,nSinks), iVar2 == 0)) &&
         (iObj = Wln_NtkIsAcyclic_rec(p,nSinks), pFVar1 = _stdout, iObj == 0)) {
        pcVar4 = Wln_ObjName(p,nSinks);
        fprintf(pFVar1,"Unconnected object %s\n",pcVar4);
        return 0;
      }
    }
  }
  return iObj;
}

Assistant:

int Wln_NtkIsAcyclic( Wln_Ntk_t * p )
{
    int fAcyclic, i, iObj, nUnvisited = 0 ;
    // set the traversal ID for this DFS ordering
    Wln_NtkIncrementTravId( p );   
    Wln_NtkIncrementTravId( p );   
    // iObj->TravId == pNet->nTravIds      means "iObj is on the path"
    // iObj->TravId == pNet->nTravIds - 1  means "iObj is visited but is not on the path"
    // iObj->TravId <  pNet->nTravIds - 1  means "iObj is not visited"
    // traverse the network to detect cycles
    fAcyclic = 1;
    Wln_NtkForEachCo( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Primary output %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachFf( p, iObj, i )
    {
        // traverse the output logic cone
        if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
            continue;
        // stop as soon as the first loop is detected
        fprintf( stdout, "Flip-flop %16s (ID %6d)\n", Wln_ObjName(p, iObj), iObj );
        goto finish;
    }
    Wln_NtkForEachObj( p, iObj )
        nUnvisited += !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj);
    if ( nUnvisited )
    {
        int nSinks = 0;
        Wln_NtkCreateRefs(p);
        printf( "The network has %d objects and %d (%6.2f %%) of them are not connected to the outputs.\n", 
            Wln_NtkObjNum(p), nUnvisited, 100.0*nUnvisited/Wln_NtkObjNum(p) );
        Wln_NtkForEachObj( p, iObj )
            if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                nSinks++;
        if ( nSinks )
        {
            int nPrinted = 0;
            printf( "These unconnected objects feed into %d sink objects without fanout:\n", nSinks );
            Wln_NtkForEachObj( p, iObj )
                if ( !Wln_ObjRefs(p, iObj) && !Wln_ObjIsCi(p, iObj) && !Wln_ObjIsCo(p, iObj) && !Wln_ObjIsFf(p, iObj) )
                {
                    fprintf( stdout, "Node %16s (ID %6d) of type %5s (type ID %2d)\n", 
                        Wln_ObjName(p, iObj), iObj, Abc_OperName(Wln_ObjType(p, iObj)), Wln_ObjType(p, iObj) );
                    if ( ++nPrinted == 5 )
                        break;
                }
            if ( nPrinted < nSinks )
                printf( "...\n" );
        }
        Wln_NtkForEachObj( p, iObj )
            if ( /*!Wln_ObjRefs(p, iObj) &&*/ !Wln_ObjIsTravIdPrevious(p, iObj) && !Wln_ObjIsCi(p, iObj) )
            {
                // traverse the output logic cone
                if ( (fAcyclic = Wln_NtkIsAcyclic_rec(p, iObj)) )
                    continue;
                // stop as soon as the first loop is detected
                fprintf( stdout, "Unconnected object %s\n", Wln_ObjName(p, iObj) );
                goto finish;
            }
    }
finish:
    return fAcyclic;
}